

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecmult_multi_batch_single(secp256k1_ecmult_multi_func ecmult_multi)

{
  int iVar1;
  secp256k1_scratch *psVar2;
  code *in_RDI;
  secp256k1_scratch *scratch_empty;
  ecmult_multi_data data;
  secp256k1_gej r;
  secp256k1_ge pt;
  secp256k1_scalar sc;
  secp256k1_scratch *scratch;
  secp256k1_callback *in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  secp256k1_ge *in_stack_ffffffffffffff00;
  secp256k1_callback local_28 [2];
  code *local_8;
  
  local_8 = in_RDI;
  testutil_random_ge_test(in_stack_ffffffffffffff00);
  testutil_random_scalar_order((secp256k1_scalar *)in_stack_ffffffffffffff00);
  psVar2 = secp256k1_scratch_create(local_28,in_stack_fffffffffffffee8);
  scratch = (secp256k1_scratch *)0x1;
  iVar1 = (*local_8)(&CTX->error_callback,psVar2,&stack0xffffffffffffff00,&secp256k1_scalar_zero,
                     ecmult_multi_callback,&stack0xfffffffffffffef0);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x13b0,
            "test condition failed: !ecmult_multi(&CTX->error_callback, scratch_empty, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1)"
           );
    abort();
  }
  secp256k1_scratch_destroy(in_stack_fffffffffffffee0,scratch);
  return;
}

Assistant:

static void test_ecmult_multi_batch_single(secp256k1_ecmult_multi_func ecmult_multi) {
    secp256k1_scalar sc;
    secp256k1_ge pt;
    secp256k1_gej r;
    ecmult_multi_data data;
    secp256k1_scratch *scratch_empty;

    testutil_random_ge_test(&pt);
    testutil_random_scalar_order(&sc);
    data.sc = &sc;
    data.pt = &pt;

    /* Try to multiply 1 point, but scratch space is empty.*/
    scratch_empty = secp256k1_scratch_create(&CTX->error_callback, 0);
    CHECK(!ecmult_multi(&CTX->error_callback, scratch_empty, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1));
    secp256k1_scratch_destroy(&CTX->error_callback, scratch_empty);
}